

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O1

VersionBitsTester * __thiscall VersionBitsTester::Reset(VersionBitsTester *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  pointer ppCVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
  _Stack_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->num = (this->num / 1000) * 1000 + 1000;
  ppCVar3 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      if (ppCVar3[uVar4] != (CBlockIndex *)0x0) {
        operator_delete(ppCVar3[uVar4],0x98);
      }
      ppCVar3 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->vpblock).
                                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3)
      ;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  p_Var1 = &_Stack_70._M_impl.super__Rb_tree_header;
  lVar7 = 0;
  do {
    _Stack_70._M_impl._0_8_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::clear((_Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
             *)(&this->checker[0].cache._M_t._M_impl.field_0x0 + lVar7));
    if (_Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)
               ((long)&this->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color
               + lVar7);
      p_Var5->_M_color = _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color;
      *(_Base_ptr *)
       ((long)&this->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar7
       ) = _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent;
      *(_Base_ptr *)
       ((long)&this->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left + lVar7)
           = _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)
       ((long)&this->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right + lVar7)
           = _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var5;
      *(size_t *)
       ((long)&this->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar7) =
           _Stack_70._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::~_Rb_tree(&_Stack_70);
    _Stack_70._M_impl._0_8_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::clear((_Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
             *)(&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.field_0x0 +
               lVar7));
    if (_Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)
               ((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
                       super__Rb_tree_header._M_header + lVar7);
      p_Var5->_M_color = _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color;
      *(_Base_ptr *)
       ((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 8U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent;
      *(_Base_ptr *)
       ((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 0x10U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)
       ((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 0x18U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var5;
      *(size_t *)
       ((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_node_count + lVar7) =
           _Stack_70._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::~_Rb_tree(&_Stack_70);
    _Stack_70._M_impl._0_8_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::clear((_Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
             *)(&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.field_0x0 +
               lVar7));
    if (_Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)
               ((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
                       super__Rb_tree_header._M_header + lVar7);
      p_Var5->_M_color = _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color;
      *(_Base_ptr *)
       ((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 8U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent;
      *(_Base_ptr *)
       ((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 0x10U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)
       ((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 0x18U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var5;
      *(size_t *)
       ((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_node_count + lVar7) =
           _Stack_70._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::~_Rb_tree(&_Stack_70);
    _Stack_70._M_impl._0_8_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::clear((_Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
             *)(&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.field_0x0 +
               lVar7));
    if (_Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)
               ((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
                       super__Rb_tree_header._M_header + lVar7);
      p_Var5->_M_color = _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color;
      *(_Base_ptr *)
       ((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 8U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent;
      *(_Base_ptr *)
       ((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 0x10U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)
       ((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_header + lVar7 + 0x18U) =
           _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var5;
      *(size_t *)
       ((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
               super__Rb_tree_header._M_node_count + lVar7) =
           _Stack_70._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::~_Rb_tree(&_Stack_70);
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0x150);
  ppCVar3 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& Reset() {
        // Have each group of tests be counted by the 1000s part, starting at 1000
        num = num - (num % 1000) + 1000;

        for (unsigned int i = 0; i < vpblock.size(); i++) {
            delete vpblock[i];
        }
        for (unsigned int  i = 0; i < CHECKERS; i++) {
            checker[i] = TestConditionChecker();
            checker_delayed[i] = TestDelayedActivationConditionChecker();
            checker_always[i] = TestAlwaysActiveConditionChecker();
            checker_never[i] = TestNeverActiveConditionChecker();
        }
        vpblock.clear();
        return *this;
    }